

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateBlock(ExpressionEvalContext *ctx,ExprBlock *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  ExprBase *pEVar8;
  undefined4 extraout_var;
  ExprBase *pEVar9;
  IntrusiveList<ExprBase> *pIVar10;
  
  bVar5 = AddInstruction(ctx);
  if (!bVar5) {
    return (ExprBase *)0x0;
  }
  ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
  pSVar1 = *ppSVar7;
  pIVar10 = &expression->expressions;
  while (pEVar9 = pIVar10->head, pEVar9 != (ExprBase *)0x0) {
    pEVar8 = Evaluate(ctx,pEVar9);
    if (pEVar8 == (ExprBase *)0x0) {
      return (ExprBase *)0x0;
    }
    if (((pSVar1->continueDepth != 0) || (pSVar1->breakDepth != 0)) ||
       (pIVar10 = (IntrusiveList<ExprBase> *)&pEVar9->next, pSVar1->returnValue != (ExprBase *)0x0))
    goto LAB_00231540;
  }
  if ((expression->closures != (ExprBase *)0x0) &&
     (pEVar9 = Evaluate(ctx,expression->closures), pEVar9 == (ExprBase *)0x0)) {
    return (ExprBase *)0x0;
  }
LAB_00231540:
  pAVar2 = ctx->ctx->allocator;
  iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
  pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar6);
  pSVar3 = (expression->super_ExprBase).source;
  pTVar4 = ctx->ctx->typeVoid;
  pEVar9->typeID = 2;
  pEVar9->source = pSVar3;
  pEVar9->type = pTVar4;
  pEVar9->next = (ExprBase *)0x0;
  pEVar9->listed = false;
  pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
  pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
  return pEVar9;
}

Assistant:

ExprBase* EvaluateBlock(ExpressionEvalContext &ctx, ExprBlock *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	for(ExprBase *value = expression->expressions.head; value; value = value->next)
	{
		if(!Evaluate(ctx, value))
			return NULL;

		if(frame->continueDepth || frame->breakDepth || frame->returnValue)
			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
	}

	if(expression->closures)
	{
		if(!Evaluate(ctx, expression->closures))
			return NULL;
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}